

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

int Ivy_ManSetLevels(Ivy_Man_t *p,int fHaig)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  void *pvVar3;
  Ivy_Obj_t *pIVar4;
  uint local_54;
  uint local_48;
  uint local_28;
  int local_24;
  int LevelMax;
  int i;
  Ivy_Obj_t *pObj;
  int fHaig_local;
  Ivy_Man_t *p_local;
  
  if (fHaig != 0) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
      if (((pIVar2 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsCi(pIVar2), iVar1 != 0)) &&
         (pIVar2->pEquiv != (Ivy_Obj_t *)0x0)) {
        printf("CI %d has a choice, which will not be visualized.\n",(ulong)(uint)pIVar2->Id);
      }
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar3 = Vec_PtrEntry(p->vObjs,local_24);
    if (pvVar3 != (void *)0x0) {
      *(uint *)((long)pvVar3 + 8) = *(uint *)((long)pvVar3 + 8) & 0x7ff;
    }
  }
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pIVar2 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsCo(pIVar2), iVar1 != 0)) {
      pIVar4 = Ivy_ObjFanin0(pIVar2);
      Ivy_ManSetLevels_rec(pIVar4,fHaig);
      pIVar4 = Ivy_ObjFanin0(pIVar2);
      if (*(uint *)&pIVar4->field_0x8 >> 0xb < local_28) {
        local_48 = local_28;
      }
      else {
        pIVar2 = Ivy_ObjFanin0(pIVar2);
        local_48 = *(uint *)&pIVar2->field_0x8 >> 0xb;
      }
      local_28 = local_48;
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (((pIVar2 != (Ivy_Obj_t *)0x0) &&
        ((iVar1 = Ivy_ObjIsNode(pIVar2), iVar1 != 0 || (iVar1 = Ivy_ObjIsBuf(pIVar2), iVar1 != 0))))
       && (iVar1 = Ivy_ObjRefs(pIVar2), iVar1 == 0)) {
      Ivy_ManSetLevels_rec(pIVar2,fHaig);
      if (*(uint *)&pIVar2->field_0x8 >> 0xb < local_28) {
        local_54 = local_28;
      }
      else {
        local_54 = *(uint *)&pIVar2->field_0x8 >> 0xb;
      }
      local_28 = local_54;
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (pIVar2 != (Ivy_Obj_t *)0x0) {
      Ivy_ObjClearMarkA(pIVar2);
    }
  }
  return local_28;
}

Assistant:

int Ivy_ManSetLevels( Ivy_Man_t * p, int fHaig )
{
    Ivy_Obj_t * pObj;
    int i, LevelMax;
    // check if CIs have choices
    if ( fHaig )
    {
        Ivy_ManForEachCi( p, pObj, i )
            if ( pObj->pEquiv )
                printf( "CI %d has a choice, which will not be visualized.\n", pObj->Id );
    }
    // clean the levels
    Ivy_ManForEachObj( p, pObj, i )
        pObj->Level = 0;
    // compute the levels
    LevelMax = 0;
    Ivy_ManForEachCo( p, pObj, i )
    {
        Ivy_ManSetLevels_rec( Ivy_ObjFanin0(pObj), fHaig );
        LevelMax = IVY_MAX( LevelMax, (int)Ivy_ObjFanin0(pObj)->Level );
    }
    // compute levels of nodes without fanout
    Ivy_ManForEachObj( p, pObj, i )
        if ( (Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)) && Ivy_ObjRefs(pObj) == 0 )
        {
            Ivy_ManSetLevels_rec( pObj, fHaig );
            LevelMax = IVY_MAX( LevelMax, (int)pObj->Level );
        }
    // clean the marks
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    return LevelMax;
}